

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
diligent_spirv_cross::CompilerGLSL::type_to_location_count(CompilerGLSL *this,SPIRType *type)

{
  uint32_t uVar1;
  size_t sVar2;
  TypedID *this_00;
  SPIRType *type_00;
  uint32_t local_3c;
  uint local_2c;
  uint32_t i_1;
  uint32_t dim_count;
  uint32_t i;
  uint32_t mbr_count;
  uint32_t count;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  if (type->basetype == Struct) {
    sVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                      (&(type->member_types).
                        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                      );
    i = 0;
    for (i_1 = 0; i_1 < (uint)sVar2; i_1 = i_1 + 1) {
      this_00 = (TypedID *)
                VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::
                operator[](&(type->member_types).
                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                           ,(ulong)i_1);
      uVar1 = TypedID::operator_cast_to_unsigned_int(this_00);
      type_00 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar1);
      uVar1 = type_to_location_count(this,type_00);
      i = uVar1 + i;
    }
  }
  else {
    if (type->columns < 2) {
      local_3c = 1;
    }
    else {
      local_3c = type->columns;
    }
    i = local_3c;
  }
  sVar2 = VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>);
  for (local_2c = 0; local_2c < (uint)sVar2; local_2c = local_2c + 1) {
    uVar1 = to_array_size_literal(this,type,local_2c);
    i = uVar1 * i;
  }
  return i;
}

Assistant:

uint32_t CompilerGLSL::type_to_location_count(const SPIRType &type) const
{
	uint32_t count;
	if (type.basetype == SPIRType::Struct)
	{
		uint32_t mbr_count = uint32_t(type.member_types.size());
		count = 0;
		for (uint32_t i = 0; i < mbr_count; i++)
			count += type_to_location_count(get<SPIRType>(type.member_types[i]));
	}
	else
	{
		count = type.columns > 1 ? type.columns : 1;
	}

	uint32_t dim_count = uint32_t(type.array.size());
	for (uint32_t i = 0; i < dim_count; i++)
		count *= to_array_size_literal(type, i);

	return count;
}